

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O3

void runalltests_open_address_hash(void)

{
  planck_unit_suite_t *suite;
  
  suite = open_address_hashmap_getsuite();
  planck_unit_run_suite(suite);
  planck_unit_destroy_suite(suite);
  return;
}

Assistant:

void
runalltests_open_address_hash(
) {
	/* CuString	*output	= CuStringNew(); */
	planck_unit_suite_t *suite = open_address_hashmap_getsuite();

	planck_unit_run_suite(suite);
	/* CuSuiteSummary(suite, output); */
	/* CuSuiteDetails(suite, output); */
	/* printf("%s\n", output->buffer); */

	planck_unit_destroy_suite(suite);
	/* CuSuiteDelete(suite); */
	/* CuStringDelete(output); */
}